

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_parse.c
# Opt level: O3

void bcemit_nil(FuncState *fs,BCReg from,BCReg n)

{
  uint uVar1;
  BCInsLine *pBVar2;
  uint uVar3;
  BCIns ins;
  uint uVar4;
  BCReg BVar5;
  
  if (fs->lasttarget < fs->pc) {
    pBVar2 = fs->bcbase;
    uVar3 = fs->pc - 1;
    uVar1 = pBVar2[uVar3].ins;
    BVar5 = uVar1 >> 8 & 0xff;
    if ((char)uVar1 == ',') {
      if (from <= (uVar1 >> 0x10) + 1 && BVar5 <= from) {
        uVar4 = (n + from) - 1;
        if (uVar4 <= uVar1 >> 0x10) {
          return;
        }
        *(short *)((long)&pBVar2[uVar3].ins + 2) = (short)uVar4;
        return;
      }
    }
    else if (((uVar1 & 0xff) == 0x2b) && (uVar1 < 0x10000)) {
      if (BVar5 == from) {
        BVar5 = from;
        if (n == 1) {
          return;
        }
      }
      else {
        if (BVar5 + 1 != from) goto LAB_0011904f;
        n = n + 1;
      }
      pBVar2[uVar3].ins = (n + BVar5) * 0x10000 - 0x10000 | BVar5 << 8 | 0x2c;
      return;
    }
  }
LAB_0011904f:
  if (n == 1) {
    ins = from << 8 | 0x2b;
  }
  else {
    ins = from << 8 | (n + from) * 0x10000 - 0x10000 | 0x2c;
  }
  bcemit_INS(fs,ins);
  return;
}

Assistant:

static void bcemit_nil(FuncState *fs, BCReg from, BCReg n)
{
  if (fs->pc > fs->lasttarget) {  /* No jumps to current position? */
    BCIns *ip = &fs->bcbase[fs->pc-1].ins;
    BCReg pto, pfrom = bc_a(*ip);
    switch (bc_op(*ip)) {  /* Try to merge with the previous instruction. */
    case BC_KPRI:
      if (bc_d(*ip) != ~LJ_TNIL) break;
      if (from == pfrom) {
	if (n == 1) return;
      } else if (from == pfrom+1) {
	from = pfrom;
	n++;
      } else {
	break;
      }
      *ip = BCINS_AD(BC_KNIL, from, from+n-1);  /* Replace KPRI. */
      return;
    case BC_KNIL:
      pto = bc_d(*ip);
      if (pfrom <= from && from <= pto+1) {  /* Can we connect both ranges? */
	if (from+n-1 > pto)
	  setbc_d(ip, from+n-1);  /* Patch previous instruction range. */
	return;
      }
      break;
    default:
      break;
    }
  }
  /* Emit new instruction or replace old instruction. */
  bcemit_INS(fs, n == 1 ? BCINS_AD(BC_KPRI, from, VKNIL) :
			  BCINS_AD(BC_KNIL, from, from+n-1));
}